

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O1

Aig_Obj_t *
Saig_StrSimTableLookup(Aig_Obj_t **ppTable,Aig_Obj_t **ppNexts,int nTableSize,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  long lVar5;
  bool bVar6;
  
  lVar5 = 0;
  uVar3 = 0;
  do {
    uVar3 = uVar3 ^ *(int *)((long)Saig_StrSimHash::s_SPrimes + lVar5) *
                    *(int *)((long)(pObj->field_5).pData + lVar5);
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x40);
  pAVar4 = ppTable[(int)(uVar3 % (uint)nTableSize)];
  do {
    if (pAVar4 == (Aig_Obj_t *)0x0) {
      return (Aig_Obj_t *)0x0;
    }
    lVar5 = 0;
    do {
      iVar1 = *(int *)((long)(pAVar4->field_5).pData + lVar5 * 4);
      iVar2 = *(int *)((long)(pObj->field_5).pData + lVar5 * 4);
      if (iVar1 != iVar2) break;
      bVar6 = lVar5 != 0xf;
      lVar5 = lVar5 + 1;
    } while (bVar6);
    if (iVar1 == iVar2) {
      return pAVar4;
    }
    pAVar4 = ppNexts[pAVar4->Id];
  } while( true );
}

Assistant:

Aig_Obj_t * Saig_StrSimTableLookup( Aig_Obj_t ** ppTable, Aig_Obj_t ** ppNexts, int nTableSize, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pEntry;
    int iEntry;
    // find the hash entry
    iEntry = Saig_StrSimHash( pObj ) % nTableSize;
    // check if there are nodes with this signatures
    for ( pEntry = ppTable[iEntry]; pEntry; pEntry = Saig_ObjNext(ppNexts,pEntry) )
        if ( Saig_StrSimIsEqual( pEntry, pObj ) )
            return pEntry;
    return NULL;
}